

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O3

void __thiscall
duckdb::TableScanState::Initialize
          (TableScanState *this,vector<duckdb::StorageIndex,_true> *column_ids_p,
          optional_ptr<duckdb::ClientContext,_true> context,
          optional_ptr<duckdb::TableFilterSet,_true> table_filters,
          optional_ptr<duckdb::SampleOptions,_true> table_sampling)

{
  pointer pSVar1;
  optional_ptr<duckdb::ClientContext,_true> context_00;
  idx_t seed;
  double dVar2;
  optional_ptr<duckdb::SampleOptions,_true> local_60;
  optional_ptr<duckdb::TableFilterSet,_true> local_58;
  optional_ptr<duckdb::ClientContext,_true> local_50;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_48;
  
  local_48.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  pSVar1 = (column_ids_p->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>)
           .super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start =
       (column_ids_p->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar1;
  (this->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (column_ids_p->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (column_ids_p->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (column_ids_p->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (column_ids_p->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.ptr = table_sampling.ptr;
  local_58.ptr = table_filters.ptr;
  local_50.ptr = context.ptr;
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_48);
  if (table_filters.ptr != (TableFilterSet *)0x0) {
    optional_ptr<duckdb::ClientContext,_true>::CheckValid(&local_50);
    context_00.ptr = local_50.ptr;
    optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&local_58);
    ScanFilterInfo::Initialize(&this->filters,context_00.ptr,local_58.ptr,&this->column_ids);
  }
  if (table_sampling.ptr != (SampleOptions *)0x0) {
    optional_ptr<duckdb::SampleOptions,_true>::CheckValid(&local_60);
    (this->sampling_info).do_system_sample = (local_60.ptr)->method == SYSTEM_SAMPLE;
    optional_ptr<duckdb::SampleOptions,_true>::CheckValid(&local_60);
    dVar2 = Value::GetValue<double>(&(local_60.ptr)->sample_size);
    (this->sampling_info).sample_rate = dVar2 / 100.0;
    optional_ptr<duckdb::SampleOptions,_true>::CheckValid(&local_60);
    if (((local_60.ptr)->seed).index != 0xffffffffffffffff) {
      optional_ptr<duckdb::SampleOptions,_true>::CheckValid(&local_60);
      seed = optional_idx::GetIndex(&(local_60.ptr)->seed);
      RandomEngine::SetSeed(&(this->table_state).random,seed);
    }
  }
  return;
}

Assistant:

void TableScanState::Initialize(vector<StorageIndex> column_ids_p, optional_ptr<ClientContext> context,
                                optional_ptr<TableFilterSet> table_filters,
                                optional_ptr<SampleOptions> table_sampling) {
	this->column_ids = std::move(column_ids_p);
	if (table_filters) {
		filters.Initialize(*context, *table_filters, column_ids);
	}
	if (table_sampling) {
		sampling_info.do_system_sample = table_sampling->method == SampleMethod::SYSTEM_SAMPLE;
		sampling_info.sample_rate = table_sampling->sample_size.GetValue<double>() / 100.0;
		if (table_sampling->seed.IsValid()) {
			table_state.random.SetSeed(table_sampling->seed.GetIndex());
		}
	}
}